

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O1

QDebug operator<<(QDebug d,QAction *action)

{
  int iVar1;
  undefined7 uVar2;
  long lVar3;
  QAction *in_RDX;
  QKeySequence *pQVar4;
  char *pcVar5;
  storage_type *psVar6;
  QTextStream *pQVar7;
  char *pcVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QDebugStateSaver saver;
  QDebug local_80;
  QtPrivate local_78 [8];
  undefined1 *local_70;
  undefined1 local_68 [24];
  QArrayDataPointer<QKeySequence> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_70,(QDebug *)action);
  pQVar7 = *(QTextStream **)action;
  pQVar7[0x30] = (QTextStream)0x0;
  QVar9.m_data = (storage_type *)0x8;
  QVar9.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar7,(QString *)&local_50);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)action,' ');
  }
  QTextStream::operator<<(*(QTextStream **)action,in_RDX);
  if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)action,' ');
  }
  if (in_RDX == (QAction *)0x0) goto LAB_0059cd0f;
  pQVar7 = *(QTextStream **)action;
  QVar10.m_data = &DAT_00000006;
  QVar10.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar10);
  QTextStream::operator<<(pQVar7,(QString *)&local_50);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)action,' ');
  }
  QAction::text((QString *)&local_50,in_RDX);
  pQVar4 = local_50.ptr;
  if (local_50.ptr == (QKeySequence *)0x0) {
    pQVar4 = (QKeySequence *)&QString::_empty;
  }
  QDebug::putString((QChar *)action,(ulong)pQVar4);
  if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)action,' ');
  }
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
    }
  }
  QAction::toolTip((QString *)&local_50,in_RDX);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_50.size != 0) {
    pQVar7 = *(QTextStream **)action;
    QVar11.m_data = (storage_type *)0x9;
    QVar11.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<(pQVar7,(QString *)&local_50);
    if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
      }
    }
    if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)action,' ');
    }
    QAction::toolTip((QString *)&local_50,in_RDX);
    if (local_50.ptr == (QKeySequence *)0x0) {
      local_50.ptr = (QKeySequence *)&QString::_empty;
    }
    QDebug::putString((QChar *)action,(ulong)local_50.ptr);
    if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)action,' ');
    }
    if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((*(byte *)(*(long *)&in_RDX->field_0x8 + 0x188) & 0x20) != 0) {
    pQVar7 = *(QTextStream **)action;
    QVar12.m_data = (storage_type *)0x9;
    QVar12.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<(pQVar7,(QString *)&local_50);
    if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
      }
    }
    if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)action,' ');
    }
    pcVar5 = "false";
    if ((~*(uint *)(*(long *)&in_RDX->field_0x8 + 0x188) & 0x60) == 0) {
      pcVar5 = "true";
    }
    QTextStream::operator<<(*(QTextStream **)action,pcVar5);
    if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)action,' ');
    }
  }
  lVar3 = *(long *)&in_RDX->field_0x8;
  local_50.d = *(Data **)(lVar3 + 0x108);
  local_50.ptr = *(QKeySequence **)(lVar3 + 0x110);
  lVar3 = *(long *)(lVar3 + 0x118);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_50.size = lVar3;
  QArrayDataPointer<QKeySequence>::~QArrayDataPointer(&local_50);
  if (lVar3 != 0) {
    pQVar7 = *(QTextStream **)action;
    QVar13.m_data = (storage_type *)0xb;
    QVar13.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<(pQVar7,(QString *)&local_50);
    if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
      }
    }
    if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)action,' ');
    }
    local_68._0_8_ = *(undefined8 *)action;
    *(int *)(local_68._0_8_ + 0x28) = *(int *)(local_68._0_8_ + 0x28) + 1;
    lVar3 = *(long *)&in_RDX->field_0x8;
    local_50.d = *(Data **)(lVar3 + 0x108);
    local_50.ptr = *(QKeySequence **)(lVar3 + 0x110);
    local_50.size = *(long *)(lVar3 + 0x118);
    if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_80.stream = (Stream *)0x0;
    QtPrivate::printSequentialContainer<QList<QKeySequence>>
              (local_78,(Stream *)local_68,"QList",(QList<QKeySequence> *)&local_50);
    QDebug::~QDebug((QDebug *)local_68);
    QDebug::~QDebug((QDebug *)local_78);
    QArrayDataPointer<QKeySequence>::~QArrayDataPointer(&local_50);
    QDebug::~QDebug(&local_80);
  }
  pQVar7 = *(QTextStream **)action;
  QVar14.m_data = (storage_type *)0xa;
  QVar14.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar14);
  QTextStream::operator<<(pQVar7,(QString *)&local_50);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)action,' ');
  }
  iVar1 = *(int *)(*(long *)&in_RDX->field_0x8 + 0x18c);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMetaObject::indexOfEnumerator((char *)&QAction::staticMetaObject);
  local_68._0_16_ = QMetaObject::enumerator(0x7f0fe0);
  lVar3 = QMetaEnum::valueToKey((ulonglong)local_68);
  pQVar7 = *(QTextStream **)action;
  if (lVar3 == 0) {
    QTextStream::operator<<(pQVar7,iVar1);
    pQVar7 = *(QTextStream **)action;
    if (pQVar7[0x30] == (QTextStream)0x1) goto LAB_0059cbdd;
  }
  else {
    psVar6 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar5 = psVar6 + lVar3 + 1;
      psVar6 = psVar6 + 1;
    } while (*pcVar5 != '\0');
    QVar15.m_data = psVar6;
    QVar15.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<(pQVar7,(QString *)&local_50);
    if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar7 = *(QTextStream **)action;
    if (pQVar7[0x30] != (QTextStream)0x0) {
LAB_0059cbdd:
      QTextStream::operator<<(pQVar7,' ');
    }
  }
  pQVar7 = *(QTextStream **)action;
  QVar16.m_data = (storage_type *)0x9;
  QVar16.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar16);
  QTextStream::operator<<(pQVar7,(QString *)&local_50);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)action,' ');
  }
  pcVar8 = "true";
  pcVar5 = "true";
  if ((*(ushort *)(*(long *)&in_RDX->field_0x8 + 0x188) & 1) == 0) {
    pcVar5 = "false";
  }
  QTextStream::operator<<(*(QTextStream **)action,pcVar5);
  if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)action,' ');
  }
  pQVar7 = *(QTextStream **)action;
  QVar17.m_data = (storage_type *)0x9;
  QVar17.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar17);
  QTextStream::operator<<(pQVar7,(QString *)&local_50);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)action,' ');
  }
  if ((*(ushort *)(*(long *)&in_RDX->field_0x8 + 0x188) & 8) == 0) {
    pcVar8 = "false";
  }
  QTextStream::operator<<(*(QTextStream **)action,pcVar8);
  if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)action,' ');
  }
LAB_0059cd0f:
  QTextStream::operator<<(*(QTextStream **)action,')');
  if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)action,' ');
  }
  uVar2 = *(undefined7 *)&action->field_0x1;
  *(undefined8 *)action = 0;
  (d.stream)->ts = (QTextStream)action->super_QObject;
  *(undefined7 *)&(d.stream)->field_0x1 = uVar2;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)d.stream;
}

Assistant:

Q_GUI_EXPORT QDebug operator<<(QDebug d, const QAction *action)
{
    QDebugStateSaver saver(d);
    d.nospace();
    d << "QAction(" << static_cast<const void *>(action);
    if (action) {
        d << " text=" << action->text();
        if (!action->toolTip().isEmpty())
            d << " toolTip=" << action->toolTip();
        if (action->isCheckable())
            d << " checked=" << action->isChecked();
#if QT_CONFIG(shortcut)
        if (!action->shortcuts().isEmpty())
            d << " shortcuts=" << action->shortcuts();
#endif
        d << " menuRole=";
        QtDebugUtils::formatQEnum(d, action->menuRole());
        d << " enabled=" << action->isEnabled();
        d << " visible=" << action->isVisible();
    }
    d << ')';
    return d;
}